

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STBase.cpp
# Opt level: O1

string * __thiscall
jbcoin::STBase::getFullText_abi_cxx11_(string *__return_storage_ptr__,STBase *this)

{
  int iVar1;
  long *local_38 [2];
  long local_28 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar1 = (*this->_vptr_STBase[4])(this);
  if (iVar1 != 0) {
    if ((this->fName->fieldName)._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    (*this->_vptr_STBase[6])(local_38,this);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_38[0]);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
STBase::getFullText() const
{
    std::string ret;

    if (getSType () != STI_NOTPRESENT)
    {
        if (fName->hasName ())
        {
            ret = fName->fieldName;
            ret += " = ";
        }

        ret += getText ();
    }

    return ret;
}